

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O0

void cppnet::GetFormatTime(char *buf,uint32_t *len,FormatTimeUnit unit)

{
  uint32_t uVar1;
  undefined4 local_a8;
  undefined4 local_a4;
  tm time;
  duration<long,_std::ratio<1L,_1L>_> local_68;
  rep local_60;
  rep sec;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  rep local_48;
  rep msec;
  uint64_t uStack_38;
  int32_t millisecond;
  time_t now_time_t;
  time_point now_time;
  FormatTimeUnit unit_local;
  uint32_t *len_local;
  char *buf_local;
  
  now_time.__d.__r._4_4_ = unit;
  now_time_t = std::chrono::_V2::system_clock::now();
  uStack_38 = std::chrono::_V2::system_clock::to_time_t((time_point *)&now_time_t);
  msec._4_4_ = 0;
  if (now_time.__d.__r._4_4_ == FTU_MILLISECOND) {
    sec = (rep)std::chrono::
               time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)&now_time_t);
    local_50.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&sec);
    local_48 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_50);
    time.tm_zone = (char *)std::chrono::
                           time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                               *)&now_time_t);
    local_68.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&time.tm_zone);
    local_60 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_68);
    msec._4_4_ = (int)local_48 + (int)local_60 * -1000;
  }
  Localtime(&stack0xffffffffffffffc8,&local_a8);
  switch(now_time.__d.__r._4_4_) {
  case FTU_YEAR:
    uVar1 = snprintf(buf,(ulong)*len,"%04d",(ulong)(time.tm_mday + 0x76c));
    *len = uVar1;
    break;
  case FTU_MONTH:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d",(ulong)(time.tm_mday + 0x76c),
                     (ulong)(time.tm_hour + 1));
    *len = uVar1;
    break;
  case FTU_DAY:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d-%02d",(ulong)(time.tm_mday + 0x76c),
                     (ulong)(time.tm_hour + 1),(ulong)(uint)time.tm_min);
    *len = uVar1;
    break;
  case FTU_HOUR:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d-%02d:%02d",(ulong)(time.tm_mday + 0x76c),
                     (ulong)(time.tm_hour + 1),(ulong)(uint)time.tm_min,time.tm_sec);
    *len = uVar1;
    break;
  case FTU_MINUTE:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d-%02d:%02d:%02d",(ulong)(time.tm_mday + 0x76c),
                     (ulong)(time.tm_hour + 1),(ulong)(uint)time.tm_min,time.tm_sec,local_a4);
    *len = uVar1;
    break;
  case FTU_SECOND:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d-%02d:%02d:%02d:%02d",(ulong)(time.tm_mday + 0x76c),
                     (ulong)(time.tm_hour + 1),(ulong)(uint)time.tm_min,time.tm_sec,local_a4,
                     local_a8);
    *len = uVar1;
    break;
  case FTU_MILLISECOND:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d-%02d:%02d:%02d:%02d:%03d",
                     (ulong)(time.tm_mday + 0x76c),(ulong)(time.tm_hour + 1),
                     (ulong)(uint)time.tm_min,time.tm_sec,local_a4,local_a8,msec._4_4_);
    *len = uVar1;
    break;
  default:
    uVar1 = snprintf(buf,(ulong)*len,"%04d-%02d-%02d:%02d:%02d:%02d:%03d",
                     (ulong)(time.tm_mday + 0x76c),(ulong)(time.tm_hour + 1),
                     (ulong)(uint)time.tm_min,time.tm_sec,local_a4,local_a8,msec._4_4_);
    *len = uVar1;
  }
  return;
}

Assistant:

void GetFormatTime(char* buf, uint32_t& len, FormatTimeUnit unit) {
    auto now_time = std::chrono::system_clock::now();
    auto now_time_t = std::chrono::system_clock::to_time_t(now_time);
    
    int32_t millisecond = 0;
    if (unit == FTU_MILLISECOND) {
        auto msec = std::chrono::duration_cast<std::chrono::milliseconds>(now_time.time_since_epoch()).count();
        auto sec = std::chrono::duration_cast<std::chrono::seconds>(now_time.time_since_epoch()).count();
        millisecond = (int32_t)(msec - (sec * 1000));
    }
    
    tm time;
    Localtime((uint64_t*)&now_time_t, (void*)&time);
    switch (unit)
    {
    case FTU_MILLISECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    case FTU_SECOND:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec);
        break;
    case FTU_MINUTE:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min);
        break;
    case FTU_HOUR:
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour);
        break;
    case FTU_DAY:
        len = snprintf(buf, len, "%04d-%02d-%02d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday);
        break;
    case FTU_MONTH:
        len = snprintf(buf, len, "%04d-%02d", 1900 + time.tm_year,  1 + time.tm_mon);
        break;
    case FTU_YEAR:
        len = snprintf(buf, len, "%04d", 1900 + time.tm_year);
        break;
    default:
        // default FTU_MILLISECOND
        len = snprintf(buf, len, "%04d-%02d-%02d:%02d:%02d:%02d:%03d", 1900 + time.tm_year,  1 + time.tm_mon,  time.tm_mday,  time.tm_hour, time.tm_min, time.tm_sec, millisecond);
        break;
    }
}